

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase827::run(TestCase827 *this)

{
  PointerBuilder builder_00;
  Reader value;
  char *local_210;
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_1;
  Builder local_1d0;
  BuilderFor<capnproto_test::capnp::test::TestNewVersion> newVersion;
  BuilderFor<capnproto_test::capnp::test::TestOldVersion> old;
  Orphan<capnproto_test::capnp::test::TestNewVersion> orphan;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  _kjCondition_1.left = (char (*) [4])root._builder.segment;
  _kjCondition_1.right._0_8_ = root._builder.capTable;
  _kjCondition_1.right.content.ptr = (char *)root._builder.pointers;
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestOldVersion>
            (&old,(Builder *)&_kjCondition_1);
  *(undefined8 *)old._builder.data = 0x4d2;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&old,value);
  _kjCondition_1.left = (char (*) [4])root._builder.segment;
  _kjCondition_1.right._0_8_ = root._builder.capTable;
  _kjCondition_1.right.content.ptr = (char *)root._builder.pointers;
  builder_00.capTable = (CapTableBuilder *)root._builder.pointers;
  builder_00.segment = (SegmentBuilder *)root._builder.capTable;
  builder_00.pointer = (WirePointer *)_kjCondition_1.right.content.size_;
  PointerHelpers<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::disown(builder_00);
  *(undefined8 *)old._builder.data = 0x3039;
  OrphanGetImpl<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::applyReader
            ((Reader *)&_kjCondition_1,&orphan.builder);
  if ((uint)_kjCondition_1.op.content.ptr < 0x40) {
    newVersion._builder.capTable = (CapTableBuilder *)0x0;
  }
  else {
    newVersion._builder.capTable = *(CapTableBuilder **)_kjCondition_1.right.content.ptr;
  }
  newVersion._builder.segment._0_4_ = 0x3039;
  newVersion._builder.data = anon_var_dwarf_b08b;
  newVersion._builder.pointers = (WirePointer *)&DAT_00000005;
  newVersion._builder.dataSize._0_1_ = newVersion._builder.capTable == (CapTableBuilder *)0x3039;
  if ((!(bool)(undefined1)newVersion._builder.dataSize) && (kj::_::Debug::minSeverity < 3)) {
    local_210 = (char *)CONCAT44(local_210._4_4_,0x3039);
    OrphanGetImpl<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::applyReader
              ((Reader *)&_kjCondition_1,&orphan.builder);
    if ((uint)_kjCondition_1.op.content.ptr < 0x40) {
      local_1d0._0_8_ = 0;
    }
    else {
      local_1d0._0_1_ = _kjCondition_1.right.content.ptr[0];
      local_1d0._1_1_ = _kjCondition_1.right.content.ptr[1];
      local_1d0._2_1_ = _kjCondition_1.right.content.ptr[2];
      local_1d0._3_1_ = _kjCondition_1.right.content.ptr[3];
      local_1d0._4_1_ = _kjCondition_1.right.content.ptr[4];
      local_1d0._5_1_ = _kjCondition_1.right.content.ptr[5];
      local_1d0._6_1_ = _kjCondition_1.right.content.ptr[6];
      local_1d0._7_1_ = _kjCondition_1.right.content.ptr[7];
    }
    kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x347,ERROR,
               "\"failed: expected \" \"(12345) == (orphan.getReader().getOld1())\", _kjCondition, 12345, orphan.getReader().getOld1()"
               ,(char (*) [59])"failed: expected (12345) == (orphan.getReader().getOld1())",
               (DebugComparison<int,_long> *)&newVersion,(int *)&local_210,(long *)&local_1d0);
  }
  local_1d0._0_8_ = "foo";
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2((Builder *)&newVersion,&old);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&_kjCondition_1,(DebugExpression<char_const(&)[4]> *)&local_1d0,(Builder *)&newVersion)
  ;
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    capnproto_test::capnp::test::TestOldVersion::Builder::getOld2((Builder *)&newVersion,&old);
    kj::_::Debug::
    log<char_const(&)[44],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x348,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (old.getOld2())\", _kjCondition, \"foo\", old.getOld2()"
               ,(char (*) [44])"failed: expected (\"foo\") == (old.getOld2())",&_kjCondition_1,
               (char (*) [4])"foo",(Builder *)&newVersion);
  }
  OrphanGetImpl<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::apply
            (&newVersion,&orphan.builder);
  _kjCondition_1.right._0_8_ = *old._builder.data;
  _kjCondition_1.left = (char (*) [4])((ulong)_kjCondition_1.left & 0xffffffff00000000);
  _kjCondition_1.right.content.ptr = " == ";
  _kjCondition_1.right.content.size_ = 5;
  _kjCondition_1.op.content.ptr._0_1_ = _kjCondition_1.right._0_8_ == 0;
  if ((_kjCondition_1.right._0_8_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_210 = (char *)((ulong)local_210 & 0xffffffff00000000);
    local_1d0._0_8_ = *old._builder.data;
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x34d,ERROR,
               "\"failed: expected \" \"(0) == (old.getOld1())\", _kjCondition, 0, old.getOld1()",
               (char (*) [40])"failed: expected (0) == (old.getOld1())",
               (DebugComparison<int,_long> *)&_kjCondition_1,(int *)&local_210,(long *)&local_1d0);
  }
  local_210 = "";
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2(&local_1d0,&old);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition_1,
             (DebugExpression<char_const(&)[1]> *)&local_210,&local_1d0);
  if (kj::_::Debug::minSeverity < 3 && _kjCondition_1.result == false) {
    capnproto_test::capnp::test::TestOldVersion::Builder::getOld2(&local_1d0,&old);
    kj::_::Debug::
    log<char_const(&)[41],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Builder>&,char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x34e,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (old.getOld2())\", _kjCondition, \"\", old.getOld2()"
               ,(char (*) [41])"failed: expected (\"\") == (old.getOld2())",
               (DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition_1,
               (char (*) [1])0x2cb4e9,&local_1d0);
  }
  _kjCondition_1.right._0_8_ = *newVersion._builder.data;
  _kjCondition_1.left = (char (*) [4])CONCAT44(_kjCondition_1.left._4_4_,0x3039);
  _kjCondition_1.right.content.ptr = " == ";
  _kjCondition_1.right.content.size_ = 5;
  _kjCondition_1.op.content.ptr._0_1_ = (char *)_kjCondition_1.right._0_8_ == (char *)0x3039;
  if (((char *)_kjCondition_1.right._0_8_ != (char *)0x3039) && (kj::_::Debug::minSeverity < 3)) {
    local_210 = (char *)CONCAT44(local_210._4_4_,0x3039);
    local_1d0._0_8_ = _kjCondition_1.right._0_8_;
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x350,ERROR,
               "\"failed: expected \" \"(12345) == (newVersion.getOld1())\", _kjCondition, 12345, newVersion.getOld1()"
               ,(char (*) [51])"failed: expected (12345) == (newVersion.getOld1())",
               (DebugComparison<int,_long> *)&_kjCondition_1,(int *)&local_210,(long *)&local_1d0);
  }
  local_210 = "foo";
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2(&local_1d0,&newVersion);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&_kjCondition_1,(DebugExpression<char_const(&)[4]> *)&local_210,&local_1d0);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    capnproto_test::capnp::test::TestNewVersion::Builder::getOld2(&local_1d0,&newVersion);
    kj::_::Debug::
    log<char_const(&)[51],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x351,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (newVersion.getOld2())\", _kjCondition, \"foo\", newVersion.getOld2()"
               ,(char (*) [51])"failed: expected (\"foo\") == (newVersion.getOld2())",
               &_kjCondition_1,(char (*) [4])"foo",&local_1d0);
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, UpgradeStruct) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  auto old = root.getAnyPointerField().initAs<test::TestOldVersion>();
  old.setOld1(1234);
  old.setOld2("foo");

  auto orphan = root.getAnyPointerField().disownAs<test::TestNewVersion>();

  // Relocation has not occurred yet.
  old.setOld1(12345);
  EXPECT_EQ(12345, orphan.getReader().getOld1());
  EXPECT_EQ("foo", old.getOld2());

  // This will relocate the struct.
  auto newVersion = orphan.get();

  EXPECT_EQ(0, old.getOld1());
  EXPECT_EQ("", old.getOld2());

  EXPECT_EQ(12345, newVersion.getOld1());
  EXPECT_EQ("foo", newVersion.getOld2());
}